

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void object_suite::test_string_collector(void)

{
  bool bVar1;
  string result;
  char input [21];
  reader reader;
  uint local_190;
  errc local_18c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  char local_168 [24];
  basic_reader<char> local_150;
  
  builtin_strncpy(local_168,"{\"alpha\":\"hydrogen\"}",0x15);
  local_188._M_dataplus._M_p = (pointer)strlen(local_168);
  local_188._M_string_length = (size_type)local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_150,(view_type *)&local_188);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_18c = local_150.decoder.current.code;
  local_190 = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x313,"void object_suite::test_string_collector()",&local_18c,&local_190);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_150);
  local_18c = CONCAT31(local_18c._1_3_,bVar1);
  local_190 = CONCAT31(local_190._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x314,"void object_suite::test_string_collector()",&local_18c,&local_190);
  local_18c = local_150.decoder.current.code;
  local_190 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x315,"void object_suite::test_string_collector()",&local_18c,&local_190);
  local_18c = trial::protocol::json::basic_reader<char>::string<std::__cxx11::string>
                        (&local_150,&local_188);
  local_190 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::errc,trial::protocol::json::errc>
            ("reader.string(result)","json::errc::no_error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x316,"void object_suite::test_string_collector()",&local_18c,&local_190);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x317,"void object_suite::test_string_collector()",&local_188,"alpha");
  local_188._M_string_length = 0;
  *local_188._M_dataplus._M_p = '\0';
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_150);
  local_18c = CONCAT31(local_18c._1_3_,bVar1);
  local_190 = CONCAT31(local_190._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x319,"void object_suite::test_string_collector()",&local_18c,&local_190);
  local_18c = local_150.decoder.current.code;
  local_190 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31a,"void object_suite::test_string_collector()",&local_18c,&local_190);
  local_18c = trial::protocol::json::basic_reader<char>::string<std::__cxx11::string>
                        (&local_150,&local_188);
  local_190 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::errc,trial::protocol::json::errc>
            ("reader.string(result)","json::errc::no_error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31b,"void object_suite::test_string_collector()",&local_18c,&local_190);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[9]>
            ("result","\"hydrogen\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31c,"void object_suite::test_string_collector()",&local_188,"hydrogen");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_150);
  local_18c = CONCAT31(local_18c._1_3_,bVar1);
  local_190 = CONCAT31(local_190._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31d,"void object_suite::test_string_collector()",&local_18c,&local_190);
  local_18c = local_150.decoder.current.code;
  local_190 = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31e,"void object_suite::test_string_collector()",&local_18c,&local_190);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_150);
  local_18c = CONCAT31(local_18c._1_3_,bVar1);
  local_190 = local_190 & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,799,"void object_suite::test_string_collector()",&local_18c,&local_190);
  local_18c = local_150.decoder.current.code;
  local_190 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,800,"void object_suite::test_string_collector()",&local_18c,&local_190);
  std::__cxx11::string::~string((string *)&local_188);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_150.stack);
  return;
}

Assistant:

void test_string_collector()
{
    const char input[] = "{\"alpha\":\"hydrogen\"}";
    json::reader reader(input);
    std::string result;
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.string(result), json::errc::no_error);
    TRIAL_PROTOCOL_TEST_EQUAL(result, "alpha");
    result.clear();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.string(result), json::errc::no_error);
    TRIAL_PROTOCOL_TEST_EQUAL(result, "hydrogen");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}